

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

string * __thiscall
(anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,LinkLibraryScopeType *type)

{
  string *in_RAX;
  long *plVar1;
  undefined8 *puVar2;
  string *psVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long *plVar4;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)this == 2) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"dotted","");
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x4fc491);
    local_88 = &local_78;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_78 = *plVar1;
      lStack_70 = puVar2[3];
    }
    else {
      local_78 = *plVar1;
      local_88 = (long *)*puVar2;
    }
    local_80 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  }
  else {
    if ((int)this != 1) {
      return in_RAX;
    }
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"dashed","");
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x4fc491);
    local_88 = &local_78;
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar1[3];
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar1;
    }
    local_80 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  }
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  psVar3 = (string *)
           std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
    psVar3 = extraout_RAX;
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
    psVar3 = extraout_RAX_00;
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
    psVar3 = extraout_RAX_01;
  }
  return psVar3;
}

Assistant:

std::string getLinkLibraryStyle(const LinkLibraryScopeType& type)
{
  std::string style;
  switch (type) {
    case LLT_SCOPE_PRIVATE:
      style = "[style = " + std::string(GRAPHVIZ_PRIVATE_EDEGE_STYLE) + "]";
      break;
    case LLT_SCOPE_INTERFACE:
      style = "[style = " + std::string(GRAPHVIZ_INTERFACE_EDEGE_STYLE) + "]";
      break;
    default:
      break;
  }
  return style;
}